

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bit_writer_utils.c
# Opt level: O3

int VP8BitWriterAppend(VP8BitWriter *bw,uint8_t *data,size_t size)

{
  int iVar1;
  int iVar2;
  
  iVar2 = 0;
  if (bw->nb_bits == -8) {
    iVar1 = BitWriterResize(bw,size);
    iVar2 = 0;
    if (iVar1 != 0) {
      memcpy(bw->buf + bw->pos,data,size);
      bw->pos = bw->pos + size;
      iVar2 = 1;
    }
  }
  return iVar2;
}

Assistant:

int VP8BitWriterAppend(VP8BitWriter* const bw,
                       const uint8_t* data, size_t size) {
  assert(data != NULL);
  if (bw->nb_bits != -8) return 0;   // Flush() must have been called
  if (!BitWriterResize(bw, size)) return 0;
  memcpy(bw->buf + bw->pos, data, size);
  bw->pos += size;
  return 1;
}